

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (align_corner == 0) {
    fVar2 = (float)w;
    fVar1 = (float)outw;
  }
  else {
    fVar2 = (float)(w + -1);
    fVar1 = (float)(outw + -1);
  }
  if (0 < outw) {
    pfVar6 = alpha + 3;
    uVar5 = 0;
    do {
      fVar9 = ((float)(int)uVar5 + 0.5) * (fVar2 / fVar1) + -0.5;
      if (align_corner != 0) {
        fVar9 = (float)(int)uVar5 * (fVar2 / fVar1);
      }
      fVar7 = floorf(fVar9);
      iVar3 = (int)fVar7;
      fVar9 = fVar9 - (float)(int)fVar7;
      fVar7 = fVar9 + 1.0;
      fVar8 = 1.0 - fVar9;
      fVar7 = (3.75 - fVar7 * 0.75) * fVar7 * fVar7 + fVar7 * -6.0 + 3.0;
      fVar9 = (fVar9 * 1.25 + -2.25) * fVar9 * fVar9 + 1.0;
      *(ulong *)(pfVar6 + -3) = CONCAT44(fVar9,fVar7);
      fVar8 = (fVar8 * 1.25 + -2.25) * fVar8 * fVar8;
      pfVar6[-1] = fVar8 + 1.0;
      *pfVar6 = -(fVar8 + fVar7 + fVar9);
      if (iVar3 < 0) {
        pfVar4 = alpha + uVar5 * 4 + 3;
        fVar7 = 1.0 - *pfVar6;
        pfVar6[-3] = fVar7;
        pfVar6[-2] = *pfVar6;
        pfVar6[-1] = 0.0;
LAB_002a7230:
        *pfVar4 = 0.0;
        iVar3 = 1;
      }
      else if (iVar3 == 0) {
        fVar7 = fVar7 + pfVar6[-2];
        pfVar6[-3] = fVar7;
        *(undefined8 *)(pfVar6 + -2) = *(undefined8 *)(pfVar6 + -1);
        pfVar4 = pfVar6;
        goto LAB_002a7230;
      }
      if (iVar3 == w + -2) {
        *pfVar6 = *pfVar6 + pfVar6[-1];
        pfVar6[-1] = pfVar6[-2];
        pfVar6[-2] = fVar7;
LAB_002a7286:
        pfVar6[-3] = 0.0;
        iVar3 = w + -3;
      }
      else if (w + -1 <= iVar3) {
        *pfVar6 = 1.0 - fVar7;
        pfVar6[-1] = fVar7;
        pfVar6[-2] = 0.0;
        goto LAB_002a7286;
      }
      xofs[uVar5] = iVar3;
      uVar5 = uVar5 + 1;
      pfVar6 = pfVar6 + 4;
    } while ((uint)outw != uVar5);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}